

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_cat.h
# Opt level: O3

string * __thiscall
absl::StrCat<std::__cxx11::string,char[30],std::__cxx11::string>
          (string *__return_storage_ptr__,absl *this,AlphaNum *a,AlphaNum *b,AlphaNum *c,AlphaNum *d
          ,AlphaNum *e,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
          char (*args_1) [30],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2)

{
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces;
  undefined8 local_a0;
  undefined8 uStack_98;
  size_t local_90;
  char *pcStack_88;
  size_t local_80;
  char *pcStack_78;
  size_t local_70;
  char *pcStack_68;
  size_t local_60;
  char *pcStack_58;
  char *local_50;
  size_t local_48;
  size_t local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  size_type local_30;
  undefined8 local_28;
  
  local_a0 = *(undefined8 *)this;
  uStack_98 = *(undefined8 *)(this + 8);
  local_90 = (a->piece_)._M_len;
  pcStack_88 = (a->piece_)._M_str;
  local_80 = (b->piece_)._M_len;
  pcStack_78 = (b->piece_)._M_str;
  local_70 = (c->piece_)._M_len;
  pcStack_68 = (c->piece_)._M_str;
  local_60 = (d->piece_)._M_len;
  pcStack_58 = (d->piece_)._M_str;
  local_48 = (e->piece_)._M_len;
  local_50 = (e->piece_)._M_str;
  local_40 = strlen((char *)args);
  local_38 = args;
  local_28 = *(undefined8 *)*args_1;
  local_30 = *(size_type *)(*args_1 + 8);
  pieces._M_len = local_30;
  pieces._M_array = (iterator)0x8;
  strings_internal::CatPieces_abi_cxx11_
            (__return_storage_ptr__,(strings_internal *)&local_a0,pieces);
  return __return_storage_ptr__;
}

Assistant:

ABSL_MUST_USE_RESULT inline std::string StrCat(
    const AlphaNum& a, const AlphaNum& b, const AlphaNum& c, const AlphaNum& d,
    const AlphaNum& e, const AV&... args) {
  return strings_internal::CatPieces(
      {a.Piece(), b.Piece(), c.Piece(), d.Piece(), e.Piece(),
       static_cast<const AlphaNum&>(args).Piece()...});
}